

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

void print_lines(char *buffer,size_t size,FILE *stream)

{
  char *pcVar1;
  void *pvVar2;
  
  pcVar1 = buffer + size;
  pvVar2 = memchr(buffer,10,size);
  while (pvVar2 != (void *)0x0) {
    fputs("# ",(FILE *)stream);
    fwrite(buffer,1,(long)((int)pvVar2 - (int)buffer),(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
    buffer = (char *)((long)pvVar2 + 1);
    size = (long)pcVar1 - (long)buffer;
    pvVar2 = memchr(buffer,10,size);
  }
  if (buffer < pcVar1) {
    fputs("# ",(FILE *)stream);
    fwrite(buffer,1,(long)(int)size,(FILE *)stream);
    fputs("\n",(FILE *)stream);
    fflush((FILE *)stream);
    return;
  }
  return;
}

Assistant:

void print_lines(const char* buffer, size_t size, FILE* stream) {
  const char* start;
  const char* end;

  start = buffer;
  while ((end = memchr(start, '\n', &buffer[size] - start))) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
    start = end + 1;
  }

  end = &buffer[size];
  if (start < end) {
    fputs("# ", stream);
    fwrite(start, 1, (int)(end - start), stream);
    fputs("\n", stream);
    fflush(stream);
  }
}